

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void printUsage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"usage: fasttext <command> <args>\n\n");
  poVar1 = std::operator<<(poVar1,"The commands supported by fasttext are:\n\n");
  poVar1 = std::operator<<(poVar1,"  supervised              train a supervised classifier\n");
  poVar1 = std::operator<<(poVar1,
                           "  quantize                quantize a model to reduce the memory usage\n"
                          );
  poVar1 = std::operator<<(poVar1,"  test                    evaluate a supervised classifier\n");
  poVar1 = std::operator<<(poVar1,
                           "  test-label              print labels with precision and recall scores\n"
                          );
  poVar1 = std::operator<<(poVar1,"  predict                 predict most likely labels\n");
  poVar1 = std::operator<<(poVar1,
                           "  predict-prob            predict most likely labels with probabilities\n"
                          );
  poVar1 = std::operator<<(poVar1,"  skipgram                train a skipgram model\n");
  poVar1 = std::operator<<(poVar1,"  cbow                    train a cbow model\n");
  poVar1 = std::operator<<(poVar1,
                           "  print-word-vectors      print word vectors given a trained model\n");
  poVar1 = std::operator<<(poVar1,
                           "  print-sentence-vectors  print sentence vectors given a trained model\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "  print-ngrams            print ngrams given a trained model and word\n"
                          );
  poVar1 = std::operator<<(poVar1,"  nn                      query for nearest neighbors\n");
  poVar1 = std::operator<<(poVar1,"  analogies               query for analogies\n");
  poVar1 = std::operator<<(poVar1,
                           "  dump                    dump arguments,dictionary,input/output vectors\n"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printUsage() {
  std::cerr
      << "usage: fasttext <command> <args>\n\n"
      << "The commands supported by fasttext are:\n\n"
      << "  supervised              train a supervised classifier\n"
      << "  quantize                quantize a model to reduce the memory "
         "usage\n"
      << "  test                    evaluate a supervised classifier\n"
      << "  test-label              print labels with precision and recall "
         "scores\n"
      << "  predict                 predict most likely labels\n"
      << "  predict-prob            predict most likely labels with "
         "probabilities\n"
      << "  skipgram                train a skipgram model\n"
      << "  cbow                    train a cbow model\n"
      << "  print-word-vectors      print word vectors given a trained model\n"
      << "  print-sentence-vectors  print sentence vectors given a trained "
         "model\n"
      << "  print-ngrams            print ngrams given a trained model and "
         "word\n"
      << "  nn                      query for nearest neighbors\n"
      << "  analogies               query for analogies\n"
      << "  dump                    dump arguments,dictionary,input/output "
         "vectors\n"
      << std::endl;
}